

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O3

void interp1Q(double x,double shift,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  double dVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar7 = (long)xi_length * 8;
  uVar6 = (long)xi_length * 4;
  if (xi_length < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  if (xi_length < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar7);
  uVar7 = (long)x_length * 8;
  if (x_length < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar7);
  pvVar4 = operator_new__(uVar6);
  if (0 < xi_length) {
    uVar7 = 0;
    do {
      dVar8 = (xi[uVar7] - x) / shift;
      *(int *)((long)pvVar4 + uVar7 * 4) = (int)dVar8;
      *(double *)((long)pvVar2 + uVar7 * 8) = dVar8 - (double)(int)dVar8;
      uVar7 = uVar7 + 1;
    } while ((uint)xi_length != uVar7);
  }
  if (1 < x_length) {
    uVar7 = 0;
    dVar8 = *y;
    do {
      dVar1 = y[uVar7 + 1];
      *(double *)((long)pvVar3 + uVar7 * 8) = dVar1 - dVar8;
      uVar7 = uVar7 + 1;
      dVar8 = dVar1;
    } while (x_length - 1 != uVar7);
  }
  *(undefined8 *)((long)pvVar3 + (long)x_length * 8 + -8) = 0;
  if (0 < xi_length) {
    uVar7 = 0;
    do {
      lVar5 = (long)*(int *)((long)pvVar4 + uVar7 * 4);
      yi[uVar7] = *(double *)((long)pvVar3 + lVar5 * 8) * *(double *)((long)pvVar2 + uVar7 * 8) +
                  y[lVar5];
      uVar7 = uVar7 + 1;
    } while ((uint)xi_length != uVar7);
  }
  operator_delete__(pvVar2);
  operator_delete__(pvVar4);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void interp1Q(double x, double shift, const double *y, int x_length,
    const double *xi, int xi_length, double *yi) {
  double *xi_fraction = new double[xi_length];
  double *delta_y = new double[x_length];
  int *xi_base = new int[xi_length];

  double delta_x = shift;
  for (int i = 0; i < xi_length; ++i) {
    xi_base[i] = static_cast<int>((xi[i] - x) / delta_x);
    xi_fraction[i] = (xi[i] - x) / delta_x - xi_base[i];
  }
  diff(y, x_length, delta_y);
  delta_y[x_length - 1] = 0.0;

  for (int i = 0; i < xi_length; ++i)
    yi[i] = y[xi_base[i]] + delta_y[xi_base[i]] * xi_fraction[i];

  // Bug was fixed at 2013/07/14 by M. Morise
  delete[] xi_fraction;
  delete[] xi_base;
  delete[] delta_y;
}